

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.h
# Opt level: O0

void printTreeView(int id,int tabs)

{
  int iVar1;
  int iVar2;
  dir_block *pdVar3;
  ostream *this;
  int local_1c;
  int nextid;
  int i;
  dir_block *p;
  int tabs_local;
  int id_local;
  
  pdVar3 = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
  for (local_1c = 0; local_1c < 0x10; local_1c = local_1c + 1) {
    iVar1 = strcmp(pdVar3->dirs[local_1c].name,"");
    if (iVar1 != 0) {
      printLines(tabs);
      this = std::operator<<((ostream *)&std::cout,pdVar3->dirs[local_1c].name);
      std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
      iVar1 = pdVar3->dirs[local_1c].inode_id;
      if (((inodes[iVar1].i_mode == 1) &&
          (iVar2 = strcmp(pdVar3->dirs[local_1c].name,"."), iVar2 != 0)) &&
         (iVar2 = strcmp(pdVar3->dirs[local_1c].name,".."), iVar2 != 0)) {
        printTreeView(iVar1,tabs + 1);
      }
    }
  }
  return;
}

Assistant:

void printTreeView(int id, int tabs) {
    dir_block *p = getAddressByLocation_Folder(inodes[id].i_blocks[0]);
    int i;
    for (i = 0; i < 16; i++) {
        if (strcmp(p->dirs[i].name, "")) {
            printLines(tabs);
            cout << p->dirs[i].name << endl;
            int nextid = p->dirs[i].inode_id;
            if (inodes[nextid].i_mode == A_FOLDER && strcmp(p->dirs[i].name, ".") && strcmp(p->dirs[i].name, "..")) {
                printTreeView(nextid, tabs + 1);
            }
        }
    }
}